

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
choosePlayerStrats(vector<char,_std::allocator<char>_> *__return_storage_ptr__,int numPlayers)

{
  bool bVar1;
  ostream *poVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  char *local_48;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38 [3];
  char local_1d;
  int local_1c;
  char playerChoice;
  int counter;
  vector<char,_std::allocator<char>_> *pvStack_10;
  int numPlayers_local;
  vector<char,_std::allocator<char>_> *strats;
  
  playerChoice = '\0';
  counter = numPlayers;
  pvStack_10 = __return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  local_1c = 1;
LAB_0011fbdd:
  do {
    poVar2 = std::operator<<((ostream *)&std::cout,"What strategy should player ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    poVar2 = std::operator<<(poVar2," use? a) aggresive b) passive c) random d) cheater");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,&local_1d);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x200);
    if (((local_1d != 'a') && (local_1d != 'b')) && (local_1d != 'c')) {
      if (local_1d != 'd') goto LAB_0011fbdd;
    }
    local_40._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(__return_storage_ptr__);
    local_48 = (char *)std::vector<char,_std::allocator<char>_>::end(__return_storage_ptr__);
    local_38[0] = std::
                  find<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                            (local_40,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       )local_48,&local_1d);
    local_50._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end(__return_storage_ptr__);
    bVar1 = __gnu_cxx::operator!=(local_38,&local_50);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Please choose a different strategy, this one is already taken by another player"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      local_1c = local_1c + 1;
      std::vector<char,_std::allocator<char>_>::push_back(__return_storage_ptr__,&local_1d);
      if (counter < local_1c) {
        return __return_storage_ptr__;
      }
    }
  } while( true );
}

Assistant:

static vector<char> choosePlayerStrats(int numPlayers) {
    vector<char> strats;
    int counter = 1;
    char playerChoice;
    do {
        cout << "What strategy should player " << counter << " use? a) aggresive b) passive c) random d) cheater"
             << std::endl;
        cin >> playerChoice;
        cin.clear();
        cin.ignore(512, '\n');
        if (playerChoice != 'a' && playerChoice != 'b' && playerChoice != 'c' && playerChoice != 'd') {
            continue;
        } else if (std::find(strats.begin(), strats.end(), playerChoice) != strats.end()) {
            cout << "Please choose a different strategy, this one is already taken by another player" << std::endl;
            continue;
        } else {
            counter++;
            strats.push_back(playerChoice);
        }
        if (counter > numPlayers) {
            break;
        }
    } while (true);
    return strats;
}